

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

bool __thiscall Clasp::DefaultUnfoundedCheck::findSource(DefaultUnfoundedCheck *this,NodeId headId)

{
  AtomData AVar1;
  pointer pAVar2;
  pointer pAVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  pointer x;
  uint local_54;
  pointer local_50;
  BodyPtr local_48;
  VarVec *local_38;
  
  local_54 = headId;
  pushUfs(this,headId);
  uVar8 = (this->ufs_).vec.ebo_.size;
  uVar7 = (this->ufs_).qFront;
  uVar11 = 0;
  if (uVar7 != uVar8) {
    local_38 = &this->invalidQ_;
    uVar11 = 0;
    do {
      (this->ufs_).qFront = uVar7 + 1;
      uVar8 = (this->ufs_).vec.ebo_.buf[uVar7];
      pAVar2 = (this->atoms_).ebo_.buf;
      local_54 = uVar8;
      if ((int)pAVar2[uVar8] < 0) {
        uVar11 = uVar11 + 1;
        pAVar2[uVar8] = (AtomData)((uint)pAVar2[uVar8] & 0xbfffffff);
      }
      else {
        pAVar3 = (this->graph_->atoms_).ebo_.buf;
        puVar4 = pAVar3[uVar8].super_Node.sep_;
        local_50 = pAVar2;
        puVar5 = pAVar3[uVar8].super_Node.adj_;
        do {
          if (puVar5 == puVar4) break;
          local_48.id = *puVar5;
          local_48.node = (this->graph_->bodies_).ebo_.buf + local_48.id;
          uVar7 = ((local_48.node)->super_Node).lit.rep_;
          bVar6 = false;
          if ((byte)(*(byte *)((long)(this->solver_->assign_).assign_.ebo_.buf +
                              (ulong)(uVar7 & 0xfffffffc)) & 3) != (byte)(((uVar7 & 2) == 0) + 1U))
          {
            if ((((*(uint *)&pAVar3[uVar8].super_Node.field_0x4 ^
                  *(uint *)&((local_48.node)->super_Node).field_0x4) & 0xfffffff) != 0) ||
               (bVar6 = isValidSource(this,&local_48), bVar6)) {
              local_50[uVar8].field_0x3 = local_50[uVar8].field_0x3 & 0xbf;
              setSource(this,local_54,&local_48);
              propagateSource(this);
              uVar11 = uVar11 + 1;
              bVar6 = true;
            }
            else {
              addUnsourced(this,&local_48);
              bVar6 = false;
            }
          }
          puVar5 = puVar5 + 1;
        } while (!bVar6);
        if (-1 < (int)local_50[uVar8]) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (local_38,&local_54);
        }
      }
      uVar8 = (this->ufs_).vec.ebo_.size;
      uVar7 = (this->ufs_).qFront;
    } while (uVar7 != uVar8);
  }
  (this->ufs_).qFront = 0;
  if (uVar11 != 0) {
    (this->ufs_).vec.ebo_.size = 0;
    (this->ufs_).qFront = 0;
    if ((uVar8 != uVar11) && (uVar9 = (ulong)(this->invalidQ_).ebo_.size, uVar9 != 0)) {
      x = (this->invalidQ_).ebo_.buf;
      lVar10 = uVar9 << 2;
      do {
        pAVar2 = (this->atoms_).ebo_.buf;
        AVar1 = pAVar2[*x];
        pAVar2[*x] = (AtomData)((uint)AVar1 & 0xbfffffff | ~(uint)AVar1 >> 1 & 0x40000000);
        if (-1 < (int)AVar1) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&(this->ufs_).vec,x);
        }
        x = x + 1;
        lVar10 = lVar10 + -4;
      } while (lVar10 != 0);
    }
  }
  (this->invalidQ_).ebo_.size = 0;
  return (this->ufs_).qFront == (this->ufs_).vec.ebo_.size;
}

Assistant:

bool DefaultUnfoundedCheck::findSource(NodeId headId) {
	assert(ufs_.empty() && invalidQ_.empty());
	const NodeId* bodyIt, *bodyEnd;
	uint32 newSource = 0;
	pushUfs(headId); // unfounded, unless we find a new source
	while (!ufs_.empty()) {
		headId         = ufs_.pop_ret(); // still marked and in vector!
		AtomData& head = atoms_[headId];
		if (!head.hasSource()) {
			const AtomNode& headNode = graph_->getAtom(headId);
			for (bodyIt = headNode.bodies_begin(), bodyEnd = headNode.bodies_end(); bodyIt != bodyEnd; ++bodyIt) {
				BodyPtr bodyNode(getBody(*bodyIt));
				if (!solver_->isFalse(bodyNode.node->lit)) {
					if (bodyNode.node->scc != headNode.scc || isValidSource(bodyNode)) {
						head.ufs = 0;               // found a new source,
						setSource(headId, bodyNode);// set the new source
						propagateSource();          // and propagate it forward
						++newSource;
						break;
					}
					else { addUnsourced(bodyNode); }
				}
			}
			if (!head.hasSource()) { // still no source - check again once we are done
				invalidQ_.push_back(headId);
			}
		}
		else {  // head has a source and is thus not unfounded
			++newSource;
			head.ufs = 0;
		}
	} // while unfounded_.emtpy() == false
	ufs_.rewind();
	if (newSource != 0) {
		// some atoms in unfounded_ have a new source
		// clear queue and check possible candidates for atoms that are still unfounded
		uint32 visited = sizeVec(ufs_.vec);
		ufs_.clear();
		if (visited != newSource) {
			// add elements that are still unfounded
			for (VarVec::iterator it = invalidQ_.begin(), end = invalidQ_.end(); it != end; ++it) {
				if ( (atoms_[*it].ufs = (1u - atoms_[*it].validS)) == 1 ) { ufs_.push(*it); }
			}
		}
	}
	invalidQ_.clear();
	return ufs_.empty();
}